

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

void __thiscall
hexedit_reader::perform(hexedit_reader *this,filesystemcollection *fslist,readercollection *rdlist)

{
  pointer puVar1;
  undefined8 *puVar2;
  ReadWriter_ptr wr;
  long *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  if (1 < g_verbose) {
    printf("dohexedit(%s, %08llx, %08zx)\n",(this->_readername)._M_dataplus._M_p,this->_ofs,
           (long)(this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  readercollection::getbyname((readercollection *)&local_28,(string *)rdlist);
  if (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 0x20))(local_28,this->_ofs);
    puVar1 = (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
    (**(code **)(*local_28 + 0x18))
              (local_28,puVar1,
               (long)(this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    }
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "hexedit: invalid rdname";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

virtual void perform(filesystemcollection& fslist, readercollection& rdlist)
    {
        if (g_verbose>1)
            printf("dohexedit(%s, %08llx, %08zx)\n", _readername.c_str(), _ofs, _data.size());

        ReadWriter_ptr wr= rdlist.getbyname(_readername);
        if (!wr) throw "hexedit: invalid rdname";
        wr->setpos(_ofs);

        wr->write(&_data[0], _data.size());
    }